

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

double insphereadapt(double *pa,double *pb,double *pc,double *pd,double *pe,double permanent)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double b;
  double b_00;
  double b_01;
  double b_02;
  double b_03;
  double b_04;
  double b_05;
  double b_06;
  double b_07;
  double b_08;
  double b_09;
  double b_10;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double _0;
  double _j;
  double _i;
  double err3;
  double err2;
  double err1;
  double blo;
  double bhi;
  double alo;
  double ahi;
  double abig;
  double c;
  double around;
  double bround;
  double avirt;
  double bvirt;
  double deztail;
  double ceztail;
  double beztail;
  double aeztail;
  double deytail;
  double ceytail;
  double beytail;
  double aeytail;
  double dextail;
  double cextail;
  double bextail;
  double aextail;
  int finlength;
  double fin1 [1152];
  int cdlen;
  int ablen;
  double cddet [576];
  double abdet [576];
  int dlen;
  int clen;
  int blen;
  int alen;
  double ddet [288];
  double cdet [288];
  double bdet [288];
  double adet [288];
  int xylen;
  int zlen;
  int ylen;
  int xlen;
  double xydet [192];
  double zdet [96];
  double ydet [96];
  double xdet [96];
  int temp48len;
  int temp24len;
  int temp16len;
  int temp8clen;
  int temp8blen;
  int temp8alen;
  double temp48 [48];
  double temp24 [24];
  double temp16 [16];
  double temp8c [8];
  double temp8b [8];
  double temp8a [8];
  double bdeps;
  double aceps;
  double daeps;
  double cdeps;
  double bceps;
  double abeps;
  double bd3;
  double ac3;
  double da3;
  double cd3;
  double bc3;
  double ab3;
  double bd [4];
  double ac [4];
  double da [4];
  double cd [4];
  double bc [4];
  double ab [4];
  double dexbey0;
  double bexdey0;
  double cexaey0;
  double aexcey0;
  double aexdey0;
  double dexaey0;
  double dexcey0;
  double cexdey0;
  double cexbey0;
  double bexcey0;
  double bexaey0;
  double aexbey0;
  double dexbey1;
  double bexdey1;
  double cexaey1;
  double aexcey1;
  double aexdey1;
  double dexaey1;
  double dexcey1;
  double cexdey1;
  double cexbey1;
  double bexcey1;
  double bexaey1;
  double aexbey1;
  double errbound;
  double det;
  double dez;
  double cez;
  double bez;
  double aez;
  double dey;
  double cey;
  double bey;
  double aey;
  double dex;
  double cex;
  double bex;
  double aex;
  double permanent_local;
  double *pe_local;
  double *pd_local;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  
  b = *pa - *pe;
  b_00 = *pb - *pe;
  b_01 = *pc - *pe;
  b_02 = *pd - *pe;
  b_03 = pa[1] - pe[1];
  b_04 = pb[1] - pe[1];
  b_05 = pc[1] - pe[1];
  b_06 = pd[1] - pe[1];
  b_07 = pa[2] - pe[2];
  b_08 = pb[2] - pe[2];
  b_09 = pc[2] - pe[2];
  b_10 = pd[2] - pe[2];
  dVar7 = b * b_04;
  dVar8 = splitter * b - (splitter * b - b);
  dVar9 = splitter * b_04 - (splitter * b_04 - b_04);
  dVar8 = (b - dVar8) * (b_04 - dVar9) +
          -(-dVar8 * (b_04 - dVar9) + -(b - dVar8) * dVar9 + -dVar8 * dVar9 + dVar7);
  dVar9 = splitter * b_00 - (splitter * b_00 - b_00);
  dVar10 = splitter * b_03 - (splitter * b_03 - b_03);
  dVar9 = (b_00 - dVar9) * (b_03 - dVar10) +
          -(-dVar9 * (b_03 - dVar10) + -(b_00 - dVar9) * dVar10 + -dVar9 * dVar10 + b_00 * b_03);
  dVar10 = dVar8 - dVar9;
  bc[3] = (dVar8 - (dVar10 + (dVar8 - dVar10))) + ((dVar8 - dVar10) - dVar9);
  dVar8 = dVar7 + dVar10;
  dVar8 = dVar8 + (((dVar7 - (dVar8 - (dVar8 - dVar7))) + (dVar10 - (dVar8 - dVar7))) - b_00 * b_03)
  ;
  dVar7 = b_00 * b_05;
  dVar9 = splitter * b_00 - (splitter * b_00 - b_00);
  dVar10 = splitter * b_05 - (splitter * b_05 - b_05);
  dVar9 = (b_00 - dVar9) * (b_05 - dVar10) +
          -(-dVar9 * (b_05 - dVar10) + -(b_00 - dVar9) * dVar10 + -dVar9 * dVar10 + dVar7);
  dVar10 = b_01 * b_04;
  dVar11 = splitter * b_01 - (splitter * b_01 - b_01);
  dVar12 = splitter * b_04 - (splitter * b_04 - b_04);
  dVar11 = (b_01 - dVar11) * (b_04 - dVar12) +
           -(-dVar11 * (b_04 - dVar12) + -(b_01 - dVar11) * dVar12 + -dVar11 * dVar12 + dVar10);
  dVar12 = dVar9 - dVar11;
  cd[3] = (dVar9 - (dVar12 + (dVar9 - dVar12))) + ((dVar9 - dVar12) - dVar11);
  dVar9 = dVar7 + dVar12;
  dVar7 = (dVar7 - (dVar9 - (dVar9 - dVar7))) + (dVar12 - (dVar9 - dVar7));
  dVar11 = dVar7 - dVar10;
  bc[0] = (dVar7 - (dVar11 + (dVar7 - dVar11))) + ((dVar7 - dVar11) - dVar10);
  dVar7 = dVar9 + dVar11;
  bc[1] = (dVar9 - (dVar7 - (dVar7 - dVar9))) + (dVar11 - (dVar7 - dVar9));
  dVar9 = b_01 * b_06;
  dVar10 = splitter * b_01 - (splitter * b_01 - b_01);
  dVar11 = splitter * b_06 - (splitter * b_06 - b_06);
  dVar10 = (b_01 - dVar10) * (b_06 - dVar11) +
           -(-dVar10 * (b_06 - dVar11) + -(b_01 - dVar10) * dVar11 + -dVar10 * dVar11 + dVar9);
  dVar11 = b_02 * b_05;
  dVar12 = splitter * b_02 - (splitter * b_02 - b_02);
  dVar13 = splitter * b_05 - (splitter * b_05 - b_05);
  dVar12 = (b_02 - dVar12) * (b_05 - dVar13) +
           -(-dVar12 * (b_05 - dVar13) + -(b_02 - dVar12) * dVar13 + -dVar12 * dVar13 + dVar11);
  dVar13 = dVar10 - dVar12;
  da[3] = (dVar10 - (dVar13 + (dVar10 - dVar13))) + ((dVar10 - dVar13) - dVar12);
  dVar10 = dVar9 + dVar13;
  dVar9 = (dVar9 - (dVar10 - (dVar10 - dVar9))) + (dVar13 - (dVar10 - dVar9));
  dVar12 = dVar9 - dVar11;
  cd[0] = (dVar9 - (dVar12 + (dVar9 - dVar12))) + ((dVar9 - dVar12) - dVar11);
  dVar9 = dVar10 + dVar12;
  cd[1] = (dVar10 - (dVar9 - (dVar9 - dVar10))) + (dVar12 - (dVar9 - dVar10));
  dVar10 = b_02 * b_03;
  dVar11 = splitter * b_02 - (splitter * b_02 - b_02);
  dVar12 = splitter * b_03 - (splitter * b_03 - b_03);
  dVar11 = (b_02 - dVar11) * (b_03 - dVar12) +
           -(-dVar11 * (b_03 - dVar12) + -(b_02 - dVar11) * dVar12 + -dVar11 * dVar12 + dVar10);
  dVar12 = b * b_06;
  dVar13 = splitter * b - (splitter * b - b);
  dVar14 = splitter * b_06 - (splitter * b_06 - b_06);
  dVar13 = (b - dVar13) * (b_06 - dVar14) +
           -(-dVar13 * (b_06 - dVar14) + -(b - dVar13) * dVar14 + -dVar13 * dVar14 + dVar12);
  dVar14 = dVar11 - dVar13;
  ac[3] = (dVar11 - (dVar14 + (dVar11 - dVar14))) + ((dVar11 - dVar14) - dVar13);
  dVar11 = dVar10 + dVar14;
  dVar10 = (dVar10 - (dVar11 - (dVar11 - dVar10))) + (dVar14 - (dVar11 - dVar10));
  dVar13 = dVar10 - dVar12;
  da[0] = (dVar10 - (dVar13 + (dVar10 - dVar13))) + ((dVar10 - dVar13) - dVar12);
  dVar10 = dVar11 + dVar13;
  da[1] = (dVar11 - (dVar10 - (dVar10 - dVar11))) + (dVar13 - (dVar10 - dVar11));
  dVar11 = b * b_05;
  dVar12 = splitter * b - (splitter * b - b);
  dVar13 = splitter * b_05 - (splitter * b_05 - b_05);
  dVar12 = (b - dVar12) * (b_05 - dVar13) +
           -(-dVar12 * (b_05 - dVar13) + -(b - dVar12) * dVar13 + -dVar12 * dVar13 + dVar11);
  dVar13 = b_01 * b_03;
  dVar14 = splitter * b_01 - (splitter * b_01 - b_01);
  dVar15 = splitter * b_03 - (splitter * b_03 - b_03);
  dVar14 = (b_01 - dVar14) * (b_03 - dVar15) +
           -(-dVar14 * (b_03 - dVar15) + -(b_01 - dVar14) * dVar15 + -dVar14 * dVar15 + dVar13);
  dVar15 = dVar12 - dVar14;
  bd[3] = (dVar12 - (dVar15 + (dVar12 - dVar15))) + ((dVar12 - dVar15) - dVar14);
  dVar12 = dVar11 + dVar15;
  dVar11 = (dVar11 - (dVar12 - (dVar12 - dVar11))) + (dVar15 - (dVar12 - dVar11));
  dVar14 = dVar11 - dVar13;
  ac[0] = (dVar11 - (dVar14 + (dVar11 - dVar14))) + ((dVar11 - dVar14) - dVar13);
  dVar11 = dVar12 + dVar14;
  ac[1] = (dVar12 - (dVar11 - (dVar11 - dVar12))) + (dVar14 - (dVar11 - dVar12));
  dVar12 = b_00 * b_06;
  dVar13 = splitter * b_00 - (splitter * b_00 - b_00);
  dVar14 = splitter * b_06 - (splitter * b_06 - b_06);
  dVar13 = (b_00 - dVar13) * (b_06 - dVar14) +
           -(-dVar13 * (b_06 - dVar14) + -(b_00 - dVar13) * dVar14 + -dVar13 * dVar14 + dVar12);
  dVar14 = b_02 * b_04;
  dVar15 = splitter * b_02 - (splitter * b_02 - b_02);
  dVar16 = splitter * b_04 - (splitter * b_04 - b_04);
  dVar15 = (b_02 - dVar15) * (b_04 - dVar16) +
           -(-dVar15 * (b_04 - dVar16) + -(b_02 - dVar15) * dVar16 + -dVar15 * dVar16 + dVar14);
  dVar16 = dVar13 - dVar15;
  ab3 = (dVar13 - (dVar16 + (dVar13 - dVar16))) + ((dVar13 - dVar16) - dVar15);
  dVar13 = dVar12 + dVar16;
  dVar12 = (dVar12 - (dVar13 - (dVar13 - dVar12))) + (dVar16 - (dVar13 - dVar12));
  dVar15 = dVar12 - dVar14;
  bd[0] = (dVar12 - (dVar15 + (dVar12 - dVar15))) + ((dVar12 - dVar15) - dVar14);
  dVar12 = dVar13 + dVar15;
  bd[1] = (dVar13 - (dVar12 - (dVar12 - dVar13))) + (dVar15 - (dVar12 - dVar13));
  bd[2] = dVar12;
  ac[2] = dVar11;
  da[2] = dVar10;
  cd[2] = dVar9;
  bc[2] = dVar7;
  iVar1 = scale_expansion_zeroelim(4,da + 3,b_08,temp8b + 7);
  iVar2 = scale_expansion_zeroelim(4,&ab3,-b_09,temp8c + 7);
  iVar3 = scale_expansion_zeroelim(4,cd + 3,b_10,temp16 + 0xf);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,temp8b + 7,iVar2,temp8c + 7,temp24 + 0x17);
  iVar1 = fast_expansion_sum_zeroelim(iVar3,temp16 + 0xf,iVar1,temp24 + 0x17,temp48 + 0x2f);
  iVar2 = scale_expansion_zeroelim(iVar1,temp48 + 0x2f,b,(double *)&temp8blen);
  iVar2 = scale_expansion_zeroelim(iVar2,(double *)&temp8blen,-b,ydet + 0x5f);
  iVar3 = scale_expansion_zeroelim(iVar1,temp48 + 0x2f,b_03,(double *)&temp8blen);
  iVar3 = scale_expansion_zeroelim(iVar3,(double *)&temp8blen,-b_03,zdet + 0x5f);
  iVar1 = scale_expansion_zeroelim(iVar1,temp48 + 0x2f,b_07,(double *)&temp8blen);
  iVar1 = scale_expansion_zeroelim(iVar1,(double *)&temp8blen,-b_07,xydet + 0xbf);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,ydet + 0x5f,iVar3,zdet + 0x5f,(double *)&ylen);
  iVar1 = fast_expansion_sum_zeroelim(iVar2,(double *)&ylen,iVar1,xydet + 0xbf,bdet + 0x11f);
  iVar2 = scale_expansion_zeroelim(4,ac + 3,b_09,temp8b + 7);
  iVar3 = scale_expansion_zeroelim(4,bd + 3,b_10,temp8c + 7);
  iVar4 = scale_expansion_zeroelim(4,da + 3,b_07,temp16 + 0xf);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,temp8b + 7,iVar3,temp8c + 7,temp24 + 0x17);
  iVar2 = fast_expansion_sum_zeroelim(iVar4,temp16 + 0xf,iVar2,temp24 + 0x17,temp48 + 0x2f);
  iVar3 = scale_expansion_zeroelim(iVar2,temp48 + 0x2f,b_00,(double *)&temp8blen);
  iVar3 = scale_expansion_zeroelim(iVar3,(double *)&temp8blen,b_00,ydet + 0x5f);
  iVar4 = scale_expansion_zeroelim(iVar2,temp48 + 0x2f,b_04,(double *)&temp8blen);
  iVar4 = scale_expansion_zeroelim(iVar4,(double *)&temp8blen,b_04,zdet + 0x5f);
  iVar2 = scale_expansion_zeroelim(iVar2,temp48 + 0x2f,b_08,(double *)&temp8blen);
  iVar2 = scale_expansion_zeroelim(iVar2,(double *)&temp8blen,b_08,xydet + 0xbf);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,ydet + 0x5f,iVar4,zdet + 0x5f,(double *)&ylen);
  iVar2 = fast_expansion_sum_zeroelim(iVar3,(double *)&ylen,iVar2,xydet + 0xbf,cdet + 0x11f);
  iVar3 = scale_expansion_zeroelim(4,bc + 3,b_10,temp8b + 7);
  iVar4 = scale_expansion_zeroelim(4,&ab3,b_07,temp8c + 7);
  iVar5 = scale_expansion_zeroelim(4,ac + 3,b_08,temp16 + 0xf);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,temp8b + 7,iVar4,temp8c + 7,temp24 + 0x17);
  iVar3 = fast_expansion_sum_zeroelim(iVar5,temp16 + 0xf,iVar3,temp24 + 0x17,temp48 + 0x2f);
  iVar4 = scale_expansion_zeroelim(iVar3,temp48 + 0x2f,b_01,(double *)&temp8blen);
  iVar4 = scale_expansion_zeroelim(iVar4,(double *)&temp8blen,-b_01,ydet + 0x5f);
  iVar5 = scale_expansion_zeroelim(iVar3,temp48 + 0x2f,b_05,(double *)&temp8blen);
  iVar5 = scale_expansion_zeroelim(iVar5,(double *)&temp8blen,-b_05,zdet + 0x5f);
  iVar3 = scale_expansion_zeroelim(iVar3,temp48 + 0x2f,b_09,(double *)&temp8blen);
  iVar3 = scale_expansion_zeroelim(iVar3,(double *)&temp8blen,-b_09,xydet + 0xbf);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,ydet + 0x5f,iVar5,zdet + 0x5f,(double *)&ylen);
  iVar3 = fast_expansion_sum_zeroelim(iVar4,(double *)&ylen,iVar3,xydet + 0xbf,ddet + 0x11f);
  iVar4 = scale_expansion_zeroelim(4,cd + 3,b_07,temp8b + 7);
  iVar5 = scale_expansion_zeroelim(4,bd + 3,-b_08,temp8c + 7);
  iVar6 = scale_expansion_zeroelim(4,bc + 3,b_09,temp16 + 0xf);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,temp8b + 7,iVar5,temp8c + 7,temp24 + 0x17);
  iVar4 = fast_expansion_sum_zeroelim(iVar6,temp16 + 0xf,iVar4,temp24 + 0x17,temp48 + 0x2f);
  iVar5 = scale_expansion_zeroelim(iVar4,temp48 + 0x2f,b_02,(double *)&temp8blen);
  iVar5 = scale_expansion_zeroelim(iVar5,(double *)&temp8blen,b_02,ydet + 0x5f);
  iVar6 = scale_expansion_zeroelim(iVar4,temp48 + 0x2f,b_06,(double *)&temp8blen);
  iVar6 = scale_expansion_zeroelim(iVar6,(double *)&temp8blen,b_06,zdet + 0x5f);
  iVar4 = scale_expansion_zeroelim(iVar4,temp48 + 0x2f,b_10,(double *)&temp8blen);
  iVar4 = scale_expansion_zeroelim(iVar4,(double *)&temp8blen,b_10,xydet + 0xbf);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,ydet + 0x5f,iVar6,zdet + 0x5f,(double *)&ylen);
  iVar4 = fast_expansion_sum_zeroelim(iVar5,(double *)&ylen,iVar4,xydet + 0xbf,(double *)&blen);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,bdet + 0x11f,iVar2,cdet + 0x11f,cddet + 0x23f);
  iVar2 = fast_expansion_sum_zeroelim(iVar3,ddet + 0x11f,iVar4,(double *)&blen,(double *)&cdlen);
  iVar1 = fast_expansion_sum_zeroelim
                    (iVar1,cddet + 0x23f,iVar2,(double *)&cdlen,(double *)&stack0xffffffffffff7e98);
  pa_local = (double *)estimate(iVar1,(double *)&stack0xffffffffffff7e98);
  if (((double)pa_local < isperrboundB * permanent) &&
     (-(double)pa_local < isperrboundB * permanent)) {
    dVar13 = (*pa - (b + (*pa - b))) + ((*pa - b) - *pe);
    dVar14 = (pa[1] - (b_03 + (pa[1] - b_03))) + ((pa[1] - b_03) - pe[1]);
    dVar15 = (pa[2] - (b_07 + (pa[2] - b_07))) + ((pa[2] - b_07) - pe[2]);
    dVar16 = (*pb - (b_00 + (*pb - b_00))) + ((*pb - b_00) - *pe);
    dVar17 = (pb[1] - (b_04 + (pb[1] - b_04))) + ((pb[1] - b_04) - pe[1]);
    dVar18 = (pb[2] - (b_08 + (pb[2] - b_08))) + ((pb[2] - b_08) - pe[2]);
    dVar19 = (*pc - (b_01 + (*pc - b_01))) + ((*pc - b_01) - *pe);
    dVar20 = (pc[1] - (b_05 + (pc[1] - b_05))) + ((pc[1] - b_05) - pe[1]);
    dVar21 = (pc[2] - (b_09 + (pc[2] - b_09))) + ((pc[2] - b_09) - pe[2]);
    dVar22 = (*pd - (b_02 + (*pd - b_02))) + ((*pd - b_02) - *pe);
    dVar23 = (pd[1] - (b_06 + (pd[1] - b_06))) + ((pd[1] - b_06) - pe[1]);
    dVar24 = (pd[2] - (b_10 + (pd[2] - b_10))) + ((pd[2] - b_10) - pe[2]);
    if (((((dVar13 != 0.0) || (((NAN(dVar13) || (dVar14 != 0.0)) || (NAN(dVar14))))) ||
         (((dVar15 != 0.0 || (NAN(dVar15))) || (dVar16 != 0.0)))) ||
        (((NAN(dVar16) || (dVar17 != 0.0)) ||
         ((NAN(dVar17) ||
          ((((dVar18 != 0.0 || (NAN(dVar18))) || (dVar19 != 0.0)) ||
           ((NAN(dVar19) || (dVar20 != 0.0)))))))))) ||
       (((NAN(dVar20) || ((dVar21 != 0.0 || (NAN(dVar21))))) ||
        (((dVar22 != 0.0 || (((NAN(dVar22) || (dVar23 != 0.0)) || (NAN(dVar23))))) ||
         ((dVar24 != 0.0 || (NAN(dVar24))))))))) {
      dVar25 = isperrboundC * permanent + resulterrbound * ABS((double)pa_local);
      dVar26 = (b * dVar17 + b_04 * dVar13) - (b_03 * dVar16 + b_00 * dVar14);
      dVar27 = (b_00 * dVar20 + b_05 * dVar16) - (b_04 * dVar19 + b_01 * dVar17);
      dVar28 = (b_01 * dVar23 + b_06 * dVar19) - (b_05 * dVar22 + b_02 * dVar20);
      dVar29 = (b_02 * dVar14 + b_03 * dVar22) - (b_06 * dVar13 + b * dVar23);
      dVar30 = (b * dVar20 + b_05 * dVar13) - (b_03 * dVar19 + b_01 * dVar14);
      dVar31 = (b_00 * dVar23 + b_06 * dVar16) - (b_04 * dVar22 + b_02 * dVar17);
      dVar13 = ((b_08 * dVar18 + b_00 * dVar16 + b_04 * dVar17) *
                (b_07 * dVar9 + b_09 * dVar10 + b_10 * dVar11) +
               (b_10 * dVar24 + b_02 * dVar22 + b_06 * dVar23) *
               (b_09 * dVar8 + b_07 * dVar7 + -(b_08 * dVar11))) -
               ((b_07 * dVar15 + b * dVar13 + b_03 * dVar14) *
                (b_10 * dVar7 + b_08 * dVar9 + -(b_09 * dVar12)) +
               (b_09 * dVar21 + b_01 * dVar19 + b_05 * dVar20) *
               (b_08 * dVar10 + b_10 * dVar8 + b_07 * dVar12));
      pa_local = (double *)
                 (dVar13 + dVar13 +
                  (((b_08 * b_08 + b_00 * b_00 + b_04 * b_04) *
                    (b_07 * dVar28 + b_09 * dVar29 + b_10 * dVar30 +
                    dVar15 * dVar9 + dVar21 * dVar10 + dVar24 * dVar11) +
                   (b_10 * b_10 + b_02 * b_02 + b_06 * b_06) *
                   (b_09 * dVar26 + b_07 * dVar27 + -(b_08 * dVar30) +
                   dVar21 * dVar8 + dVar15 * dVar7 + -(dVar18 * dVar11))) -
                  ((b_07 * b_07 + b * b + b_03 * b_03) *
                   (b_10 * dVar27 + b_08 * dVar28 + -(b_09 * dVar31) +
                   dVar24 * dVar7 + dVar18 * dVar9 + -(dVar21 * dVar12)) +
                  (b_09 * b_09 + b_01 * b_01 + b_05 * b_05) *
                  (b_08 * dVar29 + b_10 * dVar26 + b_07 * dVar31 +
                  dVar18 * dVar10 + dVar24 * dVar8 + dVar15 * dVar12))) + (double)pa_local);
      if (((double)pa_local < dVar25) && (-(double)pa_local < dVar25)) {
        pa_local = (double *)insphereexact(pa,pb,pc,pd,pe);
      }
    }
  }
  return (double)pa_local;
}

Assistant:

REAL insphereadapt(REAL *pa, REAL *pb, REAL *pc, REAL *pd, REAL *pe,
                   REAL permanent)
{
  INEXACT REAL aex, bex, cex, dex, aey, bey, cey, dey, aez, bez, cez, dez;
  REAL det, errbound;

  INEXACT REAL aexbey1, bexaey1, bexcey1, cexbey1;
  INEXACT REAL cexdey1, dexcey1, dexaey1, aexdey1;
  INEXACT REAL aexcey1, cexaey1, bexdey1, dexbey1;
  REAL aexbey0, bexaey0, bexcey0, cexbey0;
  REAL cexdey0, dexcey0, dexaey0, aexdey0;
  REAL aexcey0, cexaey0, bexdey0, dexbey0;
  REAL ab[4], bc[4], cd[4], da[4], ac[4], bd[4];
  INEXACT REAL ab3, bc3, cd3, da3, ac3, bd3;
  REAL abeps, bceps, cdeps, daeps, aceps, bdeps;
  REAL temp8a[8], temp8b[8], temp8c[8], temp16[16], temp24[24], temp48[48];
  int temp8alen, temp8blen, temp8clen, temp16len, temp24len, temp48len;
  REAL xdet[96], ydet[96], zdet[96], xydet[192];
  int xlen, ylen, zlen, xylen;
  REAL adet[288], bdet[288], cdet[288], ddet[288];
  int alen, blen, clen, dlen;
  REAL abdet[576], cddet[576];
  int ablen, cdlen;
  REAL fin1[1152];
  int finlength;

  REAL aextail, bextail, cextail, dextail;
  REAL aeytail, beytail, ceytail, deytail;
  REAL aeztail, beztail, ceztail, deztail;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;


  aex = (REAL) (pa[0] - pe[0]);
  bex = (REAL) (pb[0] - pe[0]);
  cex = (REAL) (pc[0] - pe[0]);
  dex = (REAL) (pd[0] - pe[0]);
  aey = (REAL) (pa[1] - pe[1]);
  bey = (REAL) (pb[1] - pe[1]);
  cey = (REAL) (pc[1] - pe[1]);
  dey = (REAL) (pd[1] - pe[1]);
  aez = (REAL) (pa[2] - pe[2]);
  bez = (REAL) (pb[2] - pe[2]);
  cez = (REAL) (pc[2] - pe[2]);
  dez = (REAL) (pd[2] - pe[2]);

  Two_Product(aex, bey, aexbey1, aexbey0);
  Two_Product(bex, aey, bexaey1, bexaey0);
  Two_Two_Diff(aexbey1, aexbey0, bexaey1, bexaey0, ab3, ab[2], ab[1], ab[0]);
  ab[3] = ab3;

  Two_Product(bex, cey, bexcey1, bexcey0);
  Two_Product(cex, bey, cexbey1, cexbey0);
  Two_Two_Diff(bexcey1, bexcey0, cexbey1, cexbey0, bc3, bc[2], bc[1], bc[0]);
  bc[3] = bc3;

  Two_Product(cex, dey, cexdey1, cexdey0);
  Two_Product(dex, cey, dexcey1, dexcey0);
  Two_Two_Diff(cexdey1, cexdey0, dexcey1, dexcey0, cd3, cd[2], cd[1], cd[0]);
  cd[3] = cd3;

  Two_Product(dex, aey, dexaey1, dexaey0);
  Two_Product(aex, dey, aexdey1, aexdey0);
  Two_Two_Diff(dexaey1, dexaey0, aexdey1, aexdey0, da3, da[2], da[1], da[0]);
  da[3] = da3;

  Two_Product(aex, cey, aexcey1, aexcey0);
  Two_Product(cex, aey, cexaey1, cexaey0);
  Two_Two_Diff(aexcey1, aexcey0, cexaey1, cexaey0, ac3, ac[2], ac[1], ac[0]);
  ac[3] = ac3;

  Two_Product(bex, dey, bexdey1, bexdey0);
  Two_Product(dex, bey, dexbey1, dexbey0);
  Two_Two_Diff(bexdey1, bexdey0, dexbey1, dexbey0, bd3, bd[2], bd[1], bd[0]);
  bd[3] = bd3;

  temp8alen = scale_expansion_zeroelim(4, cd, bez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, -cez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, bc, dez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, aex, temp48);
  xlen = scale_expansion_zeroelim(temp48len, temp48, -aex, xdet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, aey, temp48);
  ylen = scale_expansion_zeroelim(temp48len, temp48, -aey, ydet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, aez, temp48);
  zlen = scale_expansion_zeroelim(temp48len, temp48, -aez, zdet);
  xylen = fast_expansion_sum_zeroelim(xlen, xdet, ylen, ydet, xydet);
  alen = fast_expansion_sum_zeroelim(xylen, xydet, zlen, zdet, adet);

  temp8alen = scale_expansion_zeroelim(4, da, cez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, dez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, cd, aez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, bex, temp48);
  xlen = scale_expansion_zeroelim(temp48len, temp48, bex, xdet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, bey, temp48);
  ylen = scale_expansion_zeroelim(temp48len, temp48, bey, ydet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, bez, temp48);
  zlen = scale_expansion_zeroelim(temp48len, temp48, bez, zdet);
  xylen = fast_expansion_sum_zeroelim(xlen, xdet, ylen, ydet, xydet);
  blen = fast_expansion_sum_zeroelim(xylen, xydet, zlen, zdet, bdet);

  temp8alen = scale_expansion_zeroelim(4, ab, dez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, aez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, da, bez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, cex, temp48);
  xlen = scale_expansion_zeroelim(temp48len, temp48, -cex, xdet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, cey, temp48);
  ylen = scale_expansion_zeroelim(temp48len, temp48, -cey, ydet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, cez, temp48);
  zlen = scale_expansion_zeroelim(temp48len, temp48, -cez, zdet);
  xylen = fast_expansion_sum_zeroelim(xlen, xdet, ylen, ydet, xydet);
  clen = fast_expansion_sum_zeroelim(xylen, xydet, zlen, zdet, cdet);

  temp8alen = scale_expansion_zeroelim(4, bc, aez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, -bez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, ab, cez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, dex, temp48);
  xlen = scale_expansion_zeroelim(temp48len, temp48, dex, xdet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, dey, temp48);
  ylen = scale_expansion_zeroelim(temp48len, temp48, dey, ydet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, dez, temp48);
  zlen = scale_expansion_zeroelim(temp48len, temp48, dez, zdet);
  xylen = fast_expansion_sum_zeroelim(xlen, xdet, ylen, ydet, xydet);
  dlen = fast_expansion_sum_zeroelim(xylen, xydet, zlen, zdet, ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  finlength = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, fin1);

  det = estimate(finlength, fin1);
  errbound = isperrboundB * permanent;
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  Two_Diff_Tail(pa[0], pe[0], aex, aextail);
  Two_Diff_Tail(pa[1], pe[1], aey, aeytail);
  Two_Diff_Tail(pa[2], pe[2], aez, aeztail);
  Two_Diff_Tail(pb[0], pe[0], bex, bextail);
  Two_Diff_Tail(pb[1], pe[1], bey, beytail);
  Two_Diff_Tail(pb[2], pe[2], bez, beztail);
  Two_Diff_Tail(pc[0], pe[0], cex, cextail);
  Two_Diff_Tail(pc[1], pe[1], cey, ceytail);
  Two_Diff_Tail(pc[2], pe[2], cez, ceztail);
  Two_Diff_Tail(pd[0], pe[0], dex, dextail);
  Two_Diff_Tail(pd[1], pe[1], dey, deytail);
  Two_Diff_Tail(pd[2], pe[2], dez, deztail);
  if ((aextail == 0.0) && (aeytail == 0.0) && (aeztail == 0.0)
      && (bextail == 0.0) && (beytail == 0.0) && (beztail == 0.0)
      && (cextail == 0.0) && (ceytail == 0.0) && (ceztail == 0.0)
      && (dextail == 0.0) && (deytail == 0.0) && (deztail == 0.0)) {
    return det;
  }

  errbound = isperrboundC * permanent + resulterrbound * Absolute(det);
  abeps = (aex * beytail + bey * aextail)
        - (aey * bextail + bex * aeytail);
  bceps = (bex * ceytail + cey * bextail)
        - (bey * cextail + cex * beytail);
  cdeps = (cex * deytail + dey * cextail)
        - (cey * dextail + dex * ceytail);
  daeps = (dex * aeytail + aey * dextail)
        - (dey * aextail + aex * deytail);
  aceps = (aex * ceytail + cey * aextail)
        - (aey * cextail + cex * aeytail);
  bdeps = (bex * deytail + dey * bextail)
        - (bey * dextail + dex * beytail);
  det += (((bex * bex + bey * bey + bez * bez)
           * ((cez * daeps + dez * aceps + aez * cdeps)
              + (ceztail * da3 + deztail * ac3 + aeztail * cd3))
           + (dex * dex + dey * dey + dez * dez)
           * ((aez * bceps - bez * aceps + cez * abeps)
              + (aeztail * bc3 - beztail * ac3 + ceztail * ab3)))
          - ((aex * aex + aey * aey + aez * aez)
           * ((bez * cdeps - cez * bdeps + dez * bceps)
              + (beztail * cd3 - ceztail * bd3 + deztail * bc3))
           + (cex * cex + cey * cey + cez * cez)
           * ((dez * abeps + aez * bdeps + bez * daeps)
              + (deztail * ab3 + aeztail * bd3 + beztail * da3))))
       + 2.0 * (((bex * bextail + bey * beytail + bez * beztail)
                 * (cez * da3 + dez * ac3 + aez * cd3)
                 + (dex * dextail + dey * deytail + dez * deztail)
                 * (aez * bc3 - bez * ac3 + cez * ab3))
                - ((aex * aextail + aey * aeytail + aez * aeztail)
                 * (bez * cd3 - cez * bd3 + dez * bc3)
                 + (cex * cextail + cey * ceytail + cez * ceztail)
                 * (dez * ab3 + aez * bd3 + bez * da3)));
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  return insphereexact(pa, pb, pc, pd, pe);
}